

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O0

Result * __thiscall
CoreML::
validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
          (Result *__return_storage_ptr__,CoreML *this,
          RepeatedPtrField<CoreML::Specification::FeatureDescription> *features,string *name,
          vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          *allowedFeatureTypes)

{
  undefined8 allowedFeatureTypes_00;
  int iVar1;
  int iVar2;
  FeatureDescription *pFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined4 local_68;
  int local_54;
  undefined1 local_50 [4];
  int i;
  Result result;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *allowedFeatureTypes_local;
  string *name_local;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features_local;
  
  result.m_message.field_2._8_8_ = name;
  Result::Result((Result *)local_50);
  local_54 = 0;
  do {
    iVar2 = local_54;
    iVar1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                      ((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)this);
    if (iVar1 <= iVar2) {
      std::operator+(&local_a8,"Expected feature \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)features);
      std::operator+(&local_88,&local_a8,"\' to the model is not present in the model description.")
      ;
      Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
LAB_004336ba:
      local_68 = 1;
      Result::~Result((Result *)local_50);
      return __return_storage_ptr__;
    }
    pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
             operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)this,local_54
                       );
    Specification::FeatureDescription::name_abi_cxx11_(pFVar3);
    iVar2 = std::__cxx11::string::compare((string *)features);
    allowedFeatureTypes_00 = result.m_message.field_2._8_8_;
    if (iVar2 == 0) {
      pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
               operator[]((RepeatedPtrField<CoreML::Specification::FeatureDescription> *)this,
                          local_54);
      validateSchemaTypes(__return_storage_ptr__,
                          (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                           *)allowedFeatureTypes_00,pFVar3);
      goto LAB_004336ba;
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

inline Result validateDescriptionsContainFeatureWithNameAndType(const Descriptions &features,
                                                                    const std::string &name,
                                                                    const std::vector<Specification::FeatureType::TypeCase>& allowedFeatureTypes) {
        Result result;
        for (int i = 0; i < features.size(); i++) {
            if (name.compare(features[i].name()) != 0) {
                continue;
            }
            return validateSchemaTypes(allowedFeatureTypes, features[i]);
        }

        return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH, "Expected feature '" + name + "' to the model is not present in the model description.");
    }